

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  cmScriptGeneratorIndent indent_00;
  cmScriptGeneratorIndent indent_01;
  string *dest;
  ostream *poVar1;
  string installedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string installedDir;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&installedDir,"$ENV{DESTDIR}",(allocator<char> *)&installedFile);
  dest = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&installedFile,&this->super_cmInstallGenerator,dest);
  std::__cxx11::string::append((string *)&installedDir);
  std::__cxx11::string::~string((string *)&installedFile);
  std::__cxx11::string::append((char *)&installedDir);
  std::__cxx11::string::string((string *)&installedFile,(string *)&installedDir);
  std::__cxx11::string::append((string *)&installedFile);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  std::operator<<(poVar1,"\")\n");
  indent_00.Level = indent.Level + 2;
  poVar1 = operator<<(os,indent_00);
  poVar1 = std::operator<<(poVar1,"file(DIFFERENT EXPORT_FILE_CHANGED FILES\n");
  poVar1 = operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->MainImportFile);
  std::operator<<(poVar1,"\")\n");
  poVar1 = operator<<(os,indent_00);
  std::operator<<(poVar1,"if(EXPORT_FILE_CHANGED)\n");
  indent_01.Level = indent.Level + 4;
  poVar1 = operator<<(os,indent_01);
  poVar1 = std::operator<<(poVar1,"file(GLOB OLD_CONFIG_FILES \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedDir);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_((string *)&files,this->EFGen);
  poVar1 = std::operator<<(poVar1,(string *)&files);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&files);
  poVar1 = operator<<(os,indent_01);
  std::operator<<(poVar1,"if(OLD_CONFIG_FILES)\n");
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)(indent.Level + 6));
  poVar1 = std::operator<<(poVar1,"message(STATUS \"Old export file \\\"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  std::operator<<(poVar1,"\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n");
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)(indent.Level + 6));
  std::operator<<(poVar1,"file(REMOVE ${OLD_CONFIG_FILES})\n");
  poVar1 = operator<<(os,indent_01);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = operator<<(os,indent_00);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&files,&this->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,dest,cmInstallType_FILES,&files,false,
             (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,indent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&installedFile);
  std::__cxx11::string::~string((string *)&installedDir);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = "$ENV{DESTDIR}";
  installedDir += this->ConvertToAbsoluteDestination(this->Destination);
  installedDir += "/";
  std::string installedFile = installedDir;
  installedFile += this->FileName;
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT EXPORT_FILE_CHANGED FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(EXPORT_FILE_CHANGED)\n";
  os << indentNN << "file(GLOB OLD_CONFIG_FILES \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(OLD_CONFIG_FILES)\n";
  os << indentNNN << R"(message(STATUS "Old export file \")" << installedFile
     << "\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n";
  os << indentNNN << "file(REMOVE ${OLD_CONFIG_FILES})\n";
  os << indentNN << "endif()\n";
  os << indentN << "endif()\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}